

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,RegVmLoweredInstruction *instruction)

{
  VariableData *pVVar1;
  RegVmLoweredInstruction *pRVar2;
  RegVmLoweredFunction *pRVar3;
  uchar *val;
  RegVmLoweredInstruction **ppRVar4;
  uint i;
  uint uVar5;
  char *__assertion;
  SmallArray<unsigned_char,_8U> *this_00;
  RegVmLoweredInstruction *instruction_local;
  
  instruction_local = instruction;
  if (instruction == (RegVmLoweredInstruction *)0x0) {
    __assertion = "instruction";
    uVar5 = 0x1e;
  }
  else if (instruction->parent == (RegVmLoweredBlock *)0x0) {
    if (instruction->prevSibling == (RegVmLoweredInstruction *)0x0) {
      if (instruction->nextSibling == (RegVmLoweredInstruction *)0x0) {
        instruction->parent = this;
        if ((instruction->argument != (VmConstant *)0x0) &&
           (pVVar1 = instruction->argument->container, pVVar1 != (VariableData *)0x0)) {
          SmallArray<RegVmLoweredInstruction_*,_4U>::push_back
                    (&pVVar1->regVmUsers,&instruction_local);
        }
        ppRVar4 = &this->lastInstruction;
        if (this->firstInstruction == (RegVmLoweredInstruction *)0x0) {
          *ppRVar4 = instruction_local;
          ppRVar4 = &this->firstInstruction;
        }
        else {
          pRVar2 = *ppRVar4;
          pRVar2->nextSibling = instruction_local;
          instruction_local->prevSibling = pRVar2;
        }
        *ppRVar4 = instruction_local;
        for (uVar5 = 0; pRVar3 = this->parent, uVar5 < (pRVar3->killedRegisters).count;
            uVar5 = uVar5 + 1) {
          this_00 = &instruction_local->preKillRegisters;
          val = SmallArray<unsigned_char,_16U>::operator[](&pRVar3->killedRegisters,uVar5);
          SmallArray<unsigned_char,_8U>::push_back(this_00,val);
        }
        (pRVar3->killedRegisters).count = 0;
        return;
      }
      __assertion = "instruction->nextSibling == NULL";
      uVar5 = 0x21;
    }
    else {
      __assertion = "instruction->prevSibling == NULL";
      uVar5 = 0x20;
    }
  }
  else {
    __assertion = "instruction->parent == NULL";
    uVar5 = 0x1f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,uVar5,
                "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
               );
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, RegVmLoweredInstruction* instruction)
{
	(void)ctx;

	assert(instruction);
	assert(instruction->parent == NULL);
	assert(instruction->prevSibling == NULL);
	assert(instruction->nextSibling == NULL);

	instruction->parent = this;

	if(instruction->argument && instruction->argument->container)
		instruction->argument->container->regVmUsers.push_back(instruction);

	if(!firstInstruction)
	{
		firstInstruction = lastInstruction = instruction;
	}
	else
	{
		lastInstruction->nextSibling = instruction;
		instruction->prevSibling = lastInstruction;

		lastInstruction = instruction;
	}

	for(unsigned i = 0; i < parent->killedRegisters.size(); i++)
		instruction->preKillRegisters.push_back(parent->killedRegisters[i]);
	parent->killedRegisters.clear();
}